

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workspace.c
# Opt level: O0

natwm_error workspace_focus_client(natwm_state *state,workspace *workspace,client *client)

{
  node *node;
  node *client_node;
  client *client_local;
  workspace *workspace_local;
  natwm_state *state_local;
  
  if (((client->is_focused & 1U) == 0) && ((client->state & CLIENT_HIDDEN) == 0)) {
    node = get_client_node_from_client(workspace->clients,client);
    if (node == (node *)0x0) {
      state_local._4_4_ = NOT_FOUND_ERROR;
    }
    else {
      focus_client(state,workspace,node,client);
      if ((workspace->is_focused & 1U) == 0) {
        workspace_set_focused(state,workspace);
      }
      state_local._4_4_ = NO_ERROR;
    }
  }
  else {
    state_local._4_4_ = INVALID_INPUT_ERROR;
  }
  return state_local._4_4_;
}

Assistant:

enum natwm_error workspace_focus_client(struct natwm_state *state, struct workspace *workspace,
                                        struct client *client)
{
        if (client->is_focused || client->state & CLIENT_HIDDEN) {
                return INVALID_INPUT_ERROR;
        }

        struct node *client_node = get_client_node_from_client(workspace->clients, client);

        if (client_node == NULL) {
                return NOT_FOUND_ERROR;
        }

        focus_client(state, workspace, client_node, client);

        if (!workspace->is_focused) {
                workspace_set_focused(state, workspace);
        }

        return NO_ERROR;
}